

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_get_system_colors.cxx
# Opt level: O0

int Fl::reload_scheme(void)

{
  int iVar1;
  Fl_Boxtype FVar2;
  Fl_Tiled_Image *this;
  int local_24;
  uint local_20;
  int i;
  int nb;
  int ng;
  int nr;
  uchar b;
  uchar g;
  uchar r;
  Fl_Window *win;
  
  if ((scheme_ == (char *)0x0) || (iVar1 = fl_ascii_strcasecmp(scheme_,"plastic"), iVar1 != 0)) {
    if ((scheme_ == (char *)0x0) || (iVar1 = fl_ascii_strcasecmp(scheme_,"gtk+"), iVar1 != 0)) {
      if ((scheme_ == (char *)0x0) || (iVar1 = fl_ascii_strcasecmp(scheme_,"gleam"), iVar1 != 0)) {
        if (scheme_bg_ != (Fl_Image *)0x0) {
          if (scheme_bg_ != (Fl_Image *)0x0) {
            (*scheme_bg_->_vptr_Fl_Image[1])();
          }
          scheme_bg_ = (Fl_Image *)0x0;
        }
        set_boxtype(FL_UP_FRAME,fl_up_frame,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_DOWN_FRAME,fl_down_frame,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_THIN_UP_FRAME,fl_thin_up_frame,'\x01','\x01','\x02','\x02');
        set_boxtype(FL_THIN_DOWN_FRAME,fl_thin_down_frame,'\x01','\x01','\x02','\x02');
        set_boxtype(FL_UP_BOX,fl_up_box,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_DOWN_BOX,fl_down_box,'\x02','\x02','\x04','\x04');
        set_boxtype(FL_THIN_UP_BOX,fl_thin_up_box,'\x01','\x01','\x02','\x02');
        set_boxtype(FL_THIN_DOWN_BOX,fl_thin_down_box,'\x01','\x01','\x02','\x02');
        set_boxtype(_FL_ROUND_UP_BOX,fl_round_up_box,'\x03','\x03','\x06','\x06');
        set_boxtype(_FL_ROUND_DOWN_BOX,fl_round_down_box,'\x03','\x03','\x06','\x06');
        scrollbar_size(0x10);
      }
      else {
        if (scheme_bg_ != (Fl_Image *)0x0) {
          if (scheme_bg_ != (Fl_Image *)0x0) {
            (*scheme_bg_->_vptr_Fl_Image[1])();
          }
          scheme_bg_ = (Fl_Image *)0x0;
        }
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_UP_FRAME,FVar2 + FL_UP_BOX);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_DOWN_FRAME,FVar2 + FL_DOWN_BOX);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_THIN_UP_FRAME,FVar2 + FL_UP_BOX);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_THIN_DOWN_FRAME,FVar2 + FL_DOWN_BOX);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_UP_BOX,FVar2);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_DOWN_BOX,FVar2 + FL_FLAT_BOX);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_THIN_UP_BOX,FVar2 + FL_UP_FRAME);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(FL_THIN_DOWN_BOX,FVar2 + FL_DOWN_FRAME);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(_FL_ROUND_UP_BOX,FVar2 + FL_THIN_UP_BOX);
        FVar2 = fl_define_FL_GLEAM_UP_BOX();
        set_boxtype(_FL_ROUND_DOWN_BOX,FVar2 + FL_THIN_DOWN_BOX);
        scrollbar_size(0xf);
      }
    }
    else {
      if (scheme_bg_ != (Fl_Image *)0x0) {
        if (scheme_bg_ != (Fl_Image *)0x0) {
          (*scheme_bg_->_vptr_Fl_Image[1])();
        }
        scheme_bg_ = (Fl_Image *)0x0;
      }
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_UP_FRAME,FVar2 + FL_UP_BOX);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_DOWN_FRAME,FVar2 + FL_DOWN_BOX);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_UP_FRAME,FVar2 + FL_THIN_UP_BOX);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_DOWN_FRAME,FVar2 + FL_THIN_DOWN_BOX);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_UP_BOX,FVar2);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_DOWN_BOX,FVar2 + FL_FLAT_BOX);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_UP_BOX,FVar2 + FL_UP_FRAME);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(FL_THIN_DOWN_BOX,FVar2 + FL_DOWN_FRAME);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(_FL_ROUND_UP_BOX,FVar2 + FL_THIN_UP_FRAME);
      FVar2 = fl_define_FL_GTK_UP_BOX();
      set_boxtype(_FL_ROUND_DOWN_BOX,FVar2 + FL_THIN_DOWN_FRAME);
      scrollbar_size(0xf);
    }
  }
  else {
    get_color(0x31,(uchar *)((long)&ng + 3),(uchar *)((long)&ng + 2),(uchar *)((long)&ng + 1));
    for (local_24 = 0; local_24 < 3; local_24 = local_24 + 1) {
      nb = ((uint)reload_scheme::levels[local_24] * (uint)ng._3_1_) / 0xe8;
      if (0xff < (uint)nb) {
        nb = 0xff;
      }
      i = ((uint)reload_scheme::levels[local_24] * (uint)ng._2_1_) / 0xe8;
      if (0xff < (uint)i) {
        i = 0xff;
      }
      local_20 = ((uint)reload_scheme::levels[local_24] * (uint)ng._1_1_) / 0xe8;
      if (0xff < local_20) {
        local_20 = 0xff;
      }
      sprintf(tile_cmap[local_24],"%c c #%02x%02x%02x",(ulong)(uint)(int)"Oo."[local_24],
              (ulong)(uint)nb,(ulong)(uint)i,(ulong)local_20);
    }
    Fl_Pixmap::uncache(&tile);
    if (scheme_bg_ == (Fl_Image *)0x0) {
      this = (Fl_Tiled_Image *)operator_new(0x38);
      Fl_Tiled_Image::Fl_Tiled_Image(this,&tile.super_Fl_Image,0,0);
      scheme_bg_ = (Fl_Image *)this;
    }
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_UP_FRAME,FVar2 + FL_UP_BOX);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_DOWN_FRAME,FVar2 + FL_DOWN_BOX);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_UP_FRAME,FVar2 + FL_UP_BOX);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_DOWN_FRAME,FVar2 + FL_DOWN_BOX);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_UP_BOX,FVar2);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_DOWN_BOX,FVar2 + FL_FLAT_BOX);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_UP_BOX,FVar2 + FL_UP_FRAME);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(FL_THIN_DOWN_BOX,FVar2 + FL_DOWN_FRAME);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(_FL_ROUND_UP_BOX,FVar2 + FL_THIN_UP_BOX);
    FVar2 = fl_define_FL_PLASTIC_UP_BOX();
    set_boxtype(_FL_ROUND_DOWN_BOX,FVar2 + FL_THIN_DOWN_BOX);
    scrollbar_size(0x10);
  }
  for (_nr = first_window(); _nr != (Fl_Window *)0x0; _nr = next_window(_nr)) {
    Fl_Widget::labeltype((Fl_Widget *)_nr,(uint)(scheme_bg_ == (Fl_Image *)0x0));
    Fl_Widget::align((Fl_Widget *)_nr,0x50);
    Fl_Widget::image((Fl_Widget *)_nr,scheme_bg_);
    Fl_Widget::redraw((Fl_Widget *)_nr);
  }
  return 1;
}

Assistant:

int Fl::reload_scheme() {
  Fl_Window *win;

  if (scheme_ && !fl_ascii_strcasecmp(scheme_, "plastic")) {
    // Update the tile image to match the background color...
    uchar r, g, b;
    int nr, ng, nb;
    int i;
//    static uchar levels[3] = { 0xff, 0xef, 0xe8 };
    // OSX 10.3 and higher use a background with less contrast...
    static uchar levels[3] = { 0xff, 0xf8, 0xf4 };

    get_color(FL_GRAY, r, g, b);

//    printf("FL_GRAY = 0x%02x 0x%02x 0x%02x\n", r, g, b);

    for (i = 0; i < 3; i ++) {
      nr = levels[i] * r / 0xe8;
      if (nr > 255) nr = 255;

      ng = levels[i] * g / 0xe8;
      if (ng > 255) ng = 255;

      nb = levels[i] * b / 0xe8;
      if (nb > 255) nb = 255;

      sprintf(tile_cmap[i], "%c c #%02x%02x%02x", "Oo."[i], nr, ng, nb);
//      puts(tile_cmap[i]);
    }

    tile.uncache();

    if (!scheme_bg_) scheme_bg_ = new Fl_Tiled_Image(&tile, 0, 0);

    // Load plastic buttons, etc...
    set_boxtype(FL_UP_FRAME,        FL_PLASTIC_UP_FRAME);
    set_boxtype(FL_DOWN_FRAME,      FL_PLASTIC_DOWN_FRAME);
    set_boxtype(FL_THIN_UP_FRAME,   FL_PLASTIC_UP_FRAME);
    set_boxtype(FL_THIN_DOWN_FRAME, FL_PLASTIC_DOWN_FRAME);

    set_boxtype(FL_UP_BOX,          FL_PLASTIC_UP_BOX);
    set_boxtype(FL_DOWN_BOX,        FL_PLASTIC_DOWN_BOX);
    set_boxtype(FL_THIN_UP_BOX,     FL_PLASTIC_THIN_UP_BOX);
    set_boxtype(FL_THIN_DOWN_BOX,   FL_PLASTIC_THIN_DOWN_BOX);
    set_boxtype(_FL_ROUND_UP_BOX,   FL_PLASTIC_ROUND_UP_BOX);
    set_boxtype(_FL_ROUND_DOWN_BOX, FL_PLASTIC_ROUND_DOWN_BOX);

    // Use standard size scrollbars...
    Fl::scrollbar_size(16);
  } else if (scheme_ && !fl_ascii_strcasecmp(scheme_, "gtk+")) {
    // Use a GTK+ inspired look-n-feel...
    if (scheme_bg_) {
      delete scheme_bg_;
      scheme_bg_ = (Fl_Image *)0;
    }

    set_boxtype(FL_UP_FRAME,        FL_GTK_UP_FRAME);
    set_boxtype(FL_DOWN_FRAME,      FL_GTK_DOWN_FRAME);
    set_boxtype(FL_THIN_UP_FRAME,   FL_GTK_THIN_UP_FRAME);
    set_boxtype(FL_THIN_DOWN_FRAME, FL_GTK_THIN_DOWN_FRAME);

    set_boxtype(FL_UP_BOX,          FL_GTK_UP_BOX);
    set_boxtype(FL_DOWN_BOX,        FL_GTK_DOWN_BOX);
    set_boxtype(FL_THIN_UP_BOX,     FL_GTK_THIN_UP_BOX);
    set_boxtype(FL_THIN_DOWN_BOX,   FL_GTK_THIN_DOWN_BOX);
    set_boxtype(_FL_ROUND_UP_BOX,   FL_GTK_ROUND_UP_BOX);
    set_boxtype(_FL_ROUND_DOWN_BOX, FL_GTK_ROUND_DOWN_BOX);

    // Use slightly thinner scrollbars...
    Fl::scrollbar_size(15);
  } else if (scheme_ && !fl_ascii_strcasecmp(scheme_, "gleam")) {
    // Use a GTK+ inspired look-n-feel...
    if (scheme_bg_) {
      delete scheme_bg_;
      scheme_bg_ = (Fl_Image *)0;
    }

    set_boxtype(FL_UP_FRAME,        FL_GLEAM_UP_FRAME);
    set_boxtype(FL_DOWN_FRAME,      FL_GLEAM_DOWN_FRAME);
    set_boxtype(FL_THIN_UP_FRAME,   FL_GLEAM_UP_FRAME);
    set_boxtype(FL_THIN_DOWN_FRAME, FL_GLEAM_DOWN_FRAME);

    set_boxtype(FL_UP_BOX,          FL_GLEAM_UP_BOX);
    set_boxtype(FL_DOWN_BOX,        FL_GLEAM_DOWN_BOX);
    set_boxtype(FL_THIN_UP_BOX,     FL_GLEAM_THIN_UP_BOX);
    set_boxtype(FL_THIN_DOWN_BOX,   FL_GLEAM_THIN_DOWN_BOX);
    set_boxtype(_FL_ROUND_UP_BOX,   FL_GLEAM_ROUND_UP_BOX);
    set_boxtype(_FL_ROUND_DOWN_BOX, FL_GLEAM_ROUND_DOWN_BOX);

    // Use slightly thinner scrollbars...
    Fl::scrollbar_size(15);
  } else {
    // Use the standard FLTK look-n-feel...
    if (scheme_bg_) {
      delete scheme_bg_;
      scheme_bg_ = (Fl_Image *)0;
    }

    set_boxtype(FL_UP_FRAME,        fl_up_frame, D1, D1, D2, D2);
    set_boxtype(FL_DOWN_FRAME,      fl_down_frame, D1, D1, D2, D2);
    set_boxtype(FL_THIN_UP_FRAME,   fl_thin_up_frame, 1, 1, 2, 2);
    set_boxtype(FL_THIN_DOWN_FRAME, fl_thin_down_frame, 1, 1, 2, 2);

    set_boxtype(FL_UP_BOX,          fl_up_box, D1, D1, D2, D2);
    set_boxtype(FL_DOWN_BOX,        fl_down_box, D1, D1, D2, D2);
    set_boxtype(FL_THIN_UP_BOX,     fl_thin_up_box, 1, 1, 2, 2);
    set_boxtype(FL_THIN_DOWN_BOX,   fl_thin_down_box, 1, 1, 2, 2);
    set_boxtype(_FL_ROUND_UP_BOX,   fl_round_up_box, 3, 3, 6, 6);
    set_boxtype(_FL_ROUND_DOWN_BOX, fl_round_down_box, 3, 3, 6, 6);

    // Use standard size scrollbars...
    Fl::scrollbar_size(16);
  }

  // Set (or clear) the background tile for all windows...

  // FIXME: This makes it impossible to assign a background image
  // and/or a label to a window. IMHO we should be able to assign a
  // background image to a window. Currently (as of FLTK 1.3.3) there
  // is the workaround to use a group inside the window to achieve this.
  // See also STR #3075.
  // AlbrechtS, 01 Mar 2015

  for (win = first_window(); win; win = next_window(win)) {
    win->labeltype(scheme_bg_ ? FL_NORMAL_LABEL : FL_NO_LABEL);
    win->align(FL_ALIGN_CENTER | FL_ALIGN_INSIDE | FL_ALIGN_CLIP);
    win->image(scheme_bg_);
    win->redraw();
  }

  return 1;
}